

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<unary_op_tuple<trng::portable_impl::uint128,_double>_> * __thiscall
Catch::Generators::
makeGenerators<unary_op_tuple<trng::portable_impl::uint128,double>,unary_op_tuple<trng::portable_impl::uint128,double>,unary_op_tuple<trng::portable_impl::uint128,double>,unary_op_tuple<trng::portable_impl::uint128,double>>
          (Generators<unary_op_tuple<trng::portable_impl::uint128,_double>_> *__return_storage_ptr__
          ,Generators *this,unary_op_tuple<trng::portable_impl::uint128,_double> *val,
          unary_op_tuple<trng::portable_impl::uint128,_double> *moreGenerators,
          unary_op_tuple<trng::portable_impl::uint128,_double> *moreGenerators_1,
          unary_op_tuple<trng::portable_impl::uint128,_double> *moreGenerators_2)

{
  long *local_30;
  
  value<unary_op_tuple<trng::portable_impl::uint128,double>>
            ((Generators *)&local_30,(unary_op_tuple<trng::portable_impl::uint128,_double> *)this);
  Generators<unary_op_tuple<trng::portable_impl::uint128,double>>::
  Generators<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,double>>,unary_op_tuple<trng::portable_impl::uint128,double>,unary_op_tuple<trng::portable_impl::uint128,double>,unary_op_tuple<trng::portable_impl::uint128,double>>
            ((Generators<unary_op_tuple<trng::portable_impl::uint128,double>> *)
             __return_storage_ptr__,
             (GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_double>_> *)&local_30,
             val,moreGenerators,moreGenerators_1);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }